

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

slot_type * __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
::slot(btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
       *this,size_type i)

{
  if (((ulong)this & 7) == 0) {
    return (slot_type *)(this + i * 8 + 0x10);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, true>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, true>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
        using C = typename std::remove_const<Char>::type;
        static_assert(
            std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
            "The argument must be a pointer to [const] [signed|unsigned] char");
        constexpr size_t alignment = Alignment();
        (void)alignment;
        assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
        return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
    }